

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtering.cpp
# Opt level: O0

void Image_Function::GetGaussianKernel
               (vector<float,_std::allocator<float>_> *filter,uint32_t width,uint32_t height,
               uint32_t kernelSize,float sigma)

{
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> __last;
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  float *pfVar5;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  float in_XMM0_Da;
  float fVar6;
  int32_t posX_1;
  float *endX_1;
  float *x_1;
  int32_t posY_1;
  float normalization;
  int32_t posX;
  int32_t posY2;
  float *endX;
  float *x;
  int32_t posY;
  float sum;
  float *endY;
  float *y;
  uint32_t twiceKernelSizePlusOne;
  float doubleSigmaPiInv;
  float doubleSigma;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  float fVar7;
  float *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff78;
  float *pfVar8;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  imageException *in_stack_ffffffffffffff90;
  float *local_68;
  int local_60;
  float local_5c;
  float *local_50;
  
  if ((((2 < in_ESI) && (2 < in_EDX)) && (in_ECX != 0)) &&
     (((in_ECX * 2 + 1 <= in_ESI && (in_ECX * 2 + 1 <= in_EDX)) && (0.0 <= in_XMM0_Da)))) {
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    std::vector<float,_std::allocator<float>_>::begin
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::vector<float,_std::allocator<float>_>::end
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    __last._M_current._4_4_ = in_stack_ffffffffffffff6c;
    __last._M_current._0_4_ = in_stack_ffffffffffffff68;
    std::fill<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,float>
              (in_stack_ffffffffffffff70,__last,in_stack_ffffffffffffff60);
    uVar1 = in_ECX * 2 + 1;
    local_50 = std::vector<float,_std::allocator<float>_>::data
                         ((vector<float,_std::allocator<float>_> *)0x11a40c);
    local_50 = local_50 +
               (ulong)(((in_EDX >> 1) - in_ECX) * in_ESI) + ((ulong)(in_ESI >> 1) - (ulong)in_ECX);
    pfVar5 = local_50 + uVar1 * in_ESI;
    local_5c = 0.0;
    local_60 = -in_ECX;
    for (; local_50 != pfVar5; local_50 = local_50 + in_ESI) {
      pfVar8 = local_50 + uVar1;
      iVar2 = local_60 * local_60;
      iVar3 = -in_ECX;
      for (local_68 = local_50; local_68 != pfVar8; local_68 = local_68 + 1) {
        fVar7 = 1.0 / (in_XMM0_Da * 2.0 * 3.1415927);
        fVar6 = expf(-(float)(iVar3 * iVar3 + iVar2) / (in_XMM0_Da * 2.0));
        *local_68 = fVar7 * fVar6;
        local_5c = *local_68 + local_5c;
        iVar3 = iVar3 + 1;
      }
      local_60 = local_60 + 1;
    }
    local_5c = 1.0 / local_5c;
    local_50 = std::vector<float,_std::allocator<float>_>::data
                         ((vector<float,_std::allocator<float>_> *)0x11a5b0);
    for (local_50 = local_50 +
                    (ulong)(((in_EDX >> 1) - in_ECX) * in_ESI) +
                    ((ulong)(in_ESI >> 1) - (ulong)in_ECX); local_50 != pfVar5;
        local_50 = local_50 + in_ESI) {
      for (pfVar8 = local_50; pfVar8 != local_50 + uVar1; pfVar8 = pfVar8 + 1) {
        *pfVar8 = local_5c * *pfVar8;
      }
    }
    return;
  }
  uVar4 = __cxa_allocate_exception(0x28);
  imageException::imageException
            (in_stack_ffffffffffffff90,
             (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  __cxa_throw(uVar4,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void GetGaussianKernel( std::vector<float> & filter, uint32_t width, uint32_t height, uint32_t kernelSize, float sigma )
    {
        if( width < 3 || height < 3 || kernelSize == 0 || width < (kernelSize * 2 + 1) || height < (kernelSize * 2 + 1) || sigma < 0 )
            throw imageException( "Incorrect input parameters for Gaussian filter kernel" );

        filter.resize( width * height );

        std::fill( filter.begin(), filter.end(), 0.0f );

        static const float pi = 3.1415926536f;
        const float doubleSigma = sigma * 2;
        const float doubleSigmaPiInv = 1.0f / (doubleSigma * pi);
        const uint32_t twiceKernelSizePlusOne = 2 * kernelSize + 1;

        float * y = filter.data() + (height / 2 - kernelSize) * width + width / 2 - kernelSize;
        const float * endY = y + twiceKernelSizePlusOne * width;

        float sum = 0;

        for( int32_t posY = -static_cast<int32_t>(kernelSize) ; y != endY; y += width, ++posY ) {
            float * x = y;
            const float * endX = x + twiceKernelSizePlusOne;
            const int32_t posY2 = posY * posY;

            for( int32_t posX = -static_cast<int32_t>(kernelSize) ; x != endX; ++x, ++posX ) {
                *x = doubleSigmaPiInv * expf( -static_cast<float>(posX * posX + posY2) / doubleSigma );
                sum += *x;
            }
        }

        const float normalization = 1.0f / sum;

        y = filter.data() + (height / 2 - kernelSize) * width + width / 2 - kernelSize;

        for( int32_t posY = -static_cast<int32_t>(kernelSize) ; y != endY; y += width, ++posY ) {
            float * x = y;
            const float * endX = x + twiceKernelSizePlusOne;

            for( int32_t posX = -static_cast<int32_t>(kernelSize) ; x != endX; ++x, ++posX ) {
                *x *= normalization;
            }
        }
    }